

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugUtilities.hpp
# Opt level: O3

void CheckDynamicType<Diligent::TextureVkImpl_const,Diligent::ITextureVk>(ITextureVk *pSrcPtr)

{
  _func_int **pp_Var1;
  string msg;
  char *in_stack_ffffffffffffffb8;
  undefined1 local_39;
  string local_38;
  char *local_18;
  char *local_10;
  
  if ((pSrcPtr != (ITextureVk *)0x0) &&
     (pp_Var1 = (pSrcPtr->super_ITexture).super_IDeviceObject.super_IObject._vptr_IObject,
     pp_Var1 != (_func_int **)&PTR_QueryInterface_009210a8)) {
    local_10 = *(char **)(pp_Var1[-1] + 8);
    local_10 = local_10 + (*local_10 == '*');
    local_18 = "N8Diligent13TextureVkImplE";
    local_39 = 0x27;
    Diligent::FormatString<char[40],char_const*,char[16],char_const*,char>
              (&local_38,(Diligent *)"Dynamic type cast failed. Src typeid: \'",
               (char (*) [40])&local_10,(char **)"\' Dst typeid: \'",(char (*) [16])&local_18,
               (char **)&local_39,in_stack_ffffffffffffffb8);
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckDynamicType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Platforms/Basic/interface/DebugUtilities.hpp"
               ,0x3f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CheckDynamicType(SrcType* pSrcPtr)
{
    VERIFY(pSrcPtr == nullptr || dynamic_cast<DstType*>(pSrcPtr) != nullptr, "Dynamic type cast failed. Src typeid: \'", typeid(*pSrcPtr).name(), "\' Dst typeid: \'", typeid(DstType).name(), '\'');
}